

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::mulbase(BN *__return_storage_ptr__,BN *this,bt *multiplier)

{
  BN local_38;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_38.ba,&this->ba);
  mulbaseappr(&local_38,multiplier);
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

const BN BN::mulbase(const bt &multiplier)const
{
    return move(BN(*this).mulbaseappr(multiplier));
}